

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::EmbeddingLayerParams::SharedCtor(EmbeddingLayerParams *this)

{
  EmbeddingLayerParams *this_local;
  
  memset(&this->weights_,0,0x21);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void EmbeddingLayerParams::SharedCtor() {
  ::memset(&weights_, 0, reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&weights_) + sizeof(hasbias_));
  _cached_size_ = 0;
}